

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

void sysbvm_functionDefinition_ensureAnalysis
               (sysbvm_context_t *context,sysbvm_functionDefinition_t **functionDefinition)

{
  sysbvm_functionDefinition_t *psVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t slotCount;
  anon_struct_48_6_8eb22647 gcFrame;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  _Var2 = sysbvm_tuple_isKindOf
                    (context,(sysbvm_tuple_t)*functionDefinition,
                     (context->roots).functionDefinitionType);
  if (_Var2) {
    psVar1 = *functionDefinition;
    if ((((psVar1->bytecode == 0) || (*(long *)(psVar1->bytecode + 0x48) == 0)) &&
        ((psVar1->sourceAnalyzedDefinition == 0 ||
         (*(long *)(psVar1->sourceAnalyzedDefinition + 0x20) == 0)))) &&
       ((*(long *)(psVar1->sourceDefinition + 0x20) != 0 &&
        (*(long *)(psVar1->sourceDefinition + 0x30) != 0)))) {
      sysbvm_functionDefinition_ensureTypeAnalysis(context,functionDefinition);
      local_78 = 0;
      sStack_70 = 0;
      local_88 = 0;
      sStack_80 = 0;
      local_98 = 0;
      sStack_90 = 0;
      local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
      local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
      local_48._12_4_ = 0;
      local_38 = 6;
      puStack_30 = (undefined1 *)&local_98;
      sysbvm_stackFrame_pushRecord(&local_48);
      local_98 = (*functionDefinition)->sourceDefinition;
      sStack_90 = (*functionDefinition)->sourceAnalyzedDefinition;
      local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
      local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
      local_50 = *(undefined8 *)(sStack_90 + 0x10);
      sysbvm_stackFrame_pushRecord(&local_60);
      local_88 = *(sysbvm_tuple_t *)(sStack_90 + 0x18);
      slotCount = 0;
      sStack_80 = local_88;
      local_78 = sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt
                           (context,*(sysbvm_tuple_t *)(local_98 + 0x30),
                            *(sysbvm_tuple_t *)(sStack_90 + 0x40),local_88,
                            *(sysbvm_tuple_t *)(sStack_90 + 0x10),(sysbvm_tuple_t *)0x0);
      sVar3 = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(sStack_80 + 0x98));
      *(sysbvm_tuple_t *)(sStack_90 + 0x20) = sVar3;
      sVar3 = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(sStack_80 + 0xa0));
      *(sysbvm_tuple_t *)(sStack_90 + 0x28) = sVar3;
      sVar3 = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(sStack_80 + 0xa8));
      *(sysbvm_tuple_t *)(sStack_90 + 0x30) = sVar3;
      sVar3 = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(sStack_80 + 0xb0));
      (*functionDefinition)->pragmas = sVar3;
      sVar3 = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(sStack_80 + 0xb8));
      psVar1 = *functionDefinition;
      psVar1->innerFunctions = sVar3;
      psVar1->primitiveName = *(sysbvm_tuple_t *)(sStack_80 + 0xc0);
      *(sysbvm_tuple_t *)(sStack_90 + 0x48) = local_78;
      uVar4 = *(ulong *)(sStack_90 + 0x20);
      if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
        slotCount = (sysbvm_tuple_t)(*(uint *)(uVar4 + 0xc) >> 3);
      }
      sStack_70 = sysbvm_array_create(context,slotCount);
      if (slotCount != 0) {
        sVar3 = 0;
        do {
          uVar4 = *(ulong *)(sStack_90 + 0x20);
          if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
            uVar4 = *(ulong *)(uVar4 + 0x10 + sVar3 * 8);
          }
          else {
            uVar4 = 0;
          }
          if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
            sVar5 = *(sysbvm_tuple_t *)(uVar4 + 0x30);
          }
          else {
            sVar5 = 0;
          }
          if (sVar5 == 0) {
            sVar5 = (context->roots).untypedType;
          }
          if ((sStack_70 & 0xf) == 0 && sStack_70 != 0) {
            *(sysbvm_tuple_t *)(sStack_70 + 0x10 + sVar3 * 8) = sVar5;
          }
          sVar3 = sVar3 + 1;
        } while (slotCount != sVar3);
      }
      sVar3 = sysbvm_type_createSequenceTupleType(context,sStack_70);
      psVar1 = *functionDefinition;
      psVar1->captureVectorType = sVar3;
      psVar1->bytecode = 0;
      psVar1->nativeCodeDefinition = 0;
      if (*(long *)(sStack_80 + 200) != 0x1f) {
        psVar1->sourceDefinition = 0;
      }
      sysbvm_functionBytecodeDirectCompiler_compileFunctionDefinition(context,psVar1);
      sysbvm_stackFrame_popRecord(&local_60);
      sysbvm_stackFrame_popRecord(&local_48);
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_functionDefinition_ensureAnalysis(sysbvm_context_t *context, sysbvm_functionDefinition_t **functionDefinition)
{
    // Make sure this is a valid function definition for analysis.
    if(!sysbvm_tuple_isKindOf(context, (sysbvm_tuple_t)*functionDefinition, context->roots.functionDefinitionType))
        return;

    // Is it already analyzed?
    if( ((*functionDefinition)->bytecode && ((sysbvm_functionBytecode_t*)(*functionDefinition)->bytecode)->captures) ||
        ((*functionDefinition)->sourceAnalyzedDefinition && ((sysbvm_functionSourceAnalyzedDefinition_t*)(*functionDefinition)->sourceAnalyzedDefinition)->captures) )
        return;

    sysbvm_functionSourceDefinition_t *sourceDefinition = (sysbvm_functionSourceDefinition_t *)(*functionDefinition)->sourceDefinition;
    if(!sourceDefinition->argumentNodes || !sourceDefinition->bodyNode)
        return;

    sysbvm_functionDefinition_analyze(context, functionDefinition);
}